

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O0

void __thiscall JPG::discreteCosineTransform(JPG *this)

{
  uint uVar1;
  MCU *pMVar2;
  uint uVar3;
  Block **ppadVar4;
  Block *padVar5;
  uint local_40;
  uint local_3c;
  uint x;
  uint y;
  Block *currentBlock;
  uint local_28;
  uint jj;
  uint ii;
  uint componentID;
  MCU *currentMCU;
  uint j;
  uint i;
  JPG *this_local;
  
  for (currentMCU._4_4_ = 0; currentMCU._4_4_ < this->mcuHeight;
      currentMCU._4_4_ = currentMCU._4_4_ + 1) {
    for (currentMCU._0_4_ = 0; (uint)currentMCU < this->mcuWidth;
        currentMCU._0_4_ = (uint)currentMCU + 1) {
      pMVar2 = this->data;
      uVar1 = this->mcuWidth;
      for (jj = 1; jj < 4; jj = jj + 1) {
        local_28 = 0;
        while( true ) {
          uVar3 = getVerticalSamplingFrequency(this,jj);
          if (uVar3 <= local_28) break;
          currentBlock._4_4_ = 0;
          while( true ) {
            uVar3 = getHorizontalSamplingFrequency(this,jj);
            if (uVar3 <= currentBlock._4_4_) break;
            ppadVar4 = MCU::operator[](pMVar2 + (currentMCU._4_4_ * uVar1 + (uint)currentMCU),jj);
            padVar5 = *ppadVar4;
            uVar3 = getHorizontalSamplingFrequency(this,jj);
            padVar5 = padVar5 + (local_28 * uVar3 + currentBlock._4_4_);
            for (local_3c = 0; local_3c < 8; local_3c = local_3c + 1) {
              for (local_40 = 0; local_40 < 8; local_40 = local_40 + 1) {
                (*padVar5)[local_3c * 8 + local_40] = (*padVar5)[local_3c * 8 + local_40] - 128.0;
              }
            }
            DCT(padVar5);
            currentBlock._4_4_ = currentBlock._4_4_ + 1;
          }
          local_28 = local_28 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void JPG::discreteCosineTransform() {
    for (uint i = 0; i < mcuHeight; i++) {
        for (uint j = 0; j < mcuWidth; j++) {
            MCU& currentMCU = data[i * mcuWidth + j];
            //iterate over 每一个component Y, cb cr
            for (uint componentID = 1; componentID <= 3; componentID++) {
                //遍历block
                for(uint ii = 0; ii < getVerticalSamplingFrequency(componentID); ii++) {
                    for(uint jj = 0; jj < getHorizontalSamplingFrequency(componentID); jj++) {
                        Block& currentBlock = currentMCU[componentID][ii * getHorizontalSamplingFrequency(componentID) + jj];
                        //遍历Block every pixels 像素
                        //在进行DCT变化之前把0~255变化到-128~127
                        for(uint y = 0; y < 8; y++) {
                            for(uint x = 0; x < 8; x++) {
                                currentBlock[y * 8 + x] = currentBlock[y * 8 + x] - 128.0;
                            }
                        }
                        DCT(currentBlock); 
                    }
                }             
            }
        }
    }  
}